

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Binasc.cpp
# Opt level: O2

int __thiscall smf::Binasc::processVlvWord(Binasc *this,ostream *out,string *word,int lineNum)

{
  char *pcVar1;
  pointer pcVar2;
  bool bVar3;
  uint uVar4;
  long lVar5;
  ostream *poVar6;
  int iVar7;
  uchar byte [5];
  
  if ((word->_M_string_length < 2) ||
     (pcVar2 = (word->_M_dataplus)._M_p, 9 < (int)pcVar2[1] - 0x30U)) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"Error on line: ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,lineNum);
    poVar6 = std::operator<<(poVar6,": \'v\' needs to be followed immediately by a decimal digit");
    std::endl<char,std::char_traits<char>>(poVar6);
    iVar7 = 0;
  }
  else {
    uVar4 = atoi(pcVar2 + 1);
    byte[0] = (byte)((int)uVar4 >> 0x1c) & 0x7f;
    byte[1] = (byte)(uVar4 >> 0x15) & 0x7f;
    byte[2] = (byte)(uVar4 >> 0xe) & 0x7f;
    byte[3] = (byte)(uVar4 >> 7) & 0x7f;
    byte[4] = (byte)uVar4 & 0x7f;
    iVar7 = 1;
    bVar3 = false;
    for (lVar5 = 0; lVar5 != 4; lVar5 = lVar5 + 1) {
      if (byte[lVar5] != 0) {
        bVar3 = true;
      }
      if (bVar3) {
        byte[lVar5] = byte[lVar5] | 0x80;
      }
    }
    lVar5 = -5;
    while (lVar5 != 0) {
      pcVar1 = &stack0xffffffffffffffe8 + lVar5;
      lVar5 = lVar5 + 1;
      if (!(bool)(~(lVar5 == 0) & -1 < *pcVar1)) {
        std::operator<<(out,*pcVar1);
      }
    }
  }
  return iVar7;
}

Assistant:

int Binasc::processVlvWord(std::ostream& out, const std::string& word,
		int lineNum) {
	if (word.size() < 2) {
		std::cerr << "Error on line: " << lineNum
			  << ": 'v' needs to be followed immediately by a decimal digit"
			  << std::endl;
		return 0;
	}
	if (!isdigit(word[1])) {
		std::cerr << "Error on line: " << lineNum
			  << ": 'v' needs to be followed immediately by a decimal digit"
			  << std::endl;
		return 0;
	}
	ulong value = atoi(&word[1]);

	uchar byte[5];
	byte[0] = (value >> 28) & 0x7f;
	byte[1] = (value >> 21) & 0x7f;
	byte[2] = (value >> 14) & 0x7f;
	byte[3] = (value >>  7) & 0x7f;
	byte[4] = (value >>  0) & 0x7f;

	int i;
	int flag = 0;
	for (i=0; i<4; i++) {
		if (byte[i] != 0) {
			flag = 1;
		}
		if (flag) {
			byte[i] |= 0x80;
		}
	}

	for (i=0; i<5; i++) {
		if (byte[i] >= 0x80 || i == 4) {
			out << byte[i];
		}
	}

	return 1;
}